

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Eltwise_x86_avx2::forward
          (Eltwise_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [12];
  undefined1 auVar21 [24];
  bool bVar22;
  float *pfVar23;
  undefined1 (*pauVar24) [32];
  size_type sVar25;
  undefined1 (*pauVar26) [24];
  undefined1 (*pauVar27) [12];
  undefined1 (*pauVar28) [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  int remain_7;
  float *outptr_23;
  float *ptr_23;
  int q_23;
  Mat *bottom_blob2_11;
  size_t b_11;
  int remain_6;
  float *outptr_22;
  float *ptr1_11;
  float *ptr_22;
  int q_22;
  Mat *bottom_blob1_11;
  int remain_5;
  float *outptr_21;
  float *ptr_21;
  int q_21;
  float coeff;
  Mat *bottom_blob2_10;
  size_t b_10;
  int remain_4;
  float *outptr_20;
  float *ptr1_10;
  float *ptr_20;
  int q_20;
  float coeff1;
  float coeff0;
  Mat *bottom_blob1_10;
  int remain_3;
  float *outptr_19;
  float *ptr_19;
  int q_19;
  Mat *bottom_blob2_9;
  size_t b_9;
  int remain_2;
  float *outptr_18;
  float *ptr1_9;
  float *ptr_18;
  int q_18;
  Mat *bottom_blob1_9;
  int remain_1;
  float *outptr_17;
  float *ptr_17;
  int q_17;
  Mat *bottom_blob2_8;
  size_t b_8;
  int remain;
  float *outptr_16;
  float *ptr1_8;
  float *ptr_16;
  int q_16;
  Mat *bottom_blob1_8;
  __m128 _p1_15;
  __m128 _p_15;
  int i_15;
  float *outptr_15;
  float *ptr_15;
  int q_15;
  Mat *bottom_blob2_7;
  size_t b_7;
  __m128 _p1_14;
  __m128 _p_14;
  int i_14;
  float *outptr_14;
  float *ptr1_7;
  float *ptr_14;
  int q_14;
  Mat *bottom_blob1_7;
  __m128 _p_13;
  __m128 _p1_13;
  int i_13;
  float *outptr_13;
  float *ptr_13;
  int q_13;
  __m128 _coeff_1;
  Mat *bottom_blob2_6;
  size_t b_6;
  __m128 _p1_12;
  __m128 _p_12;
  int i_12;
  float *outptr_12;
  float *ptr1_6;
  float *ptr_12;
  int q_12;
  __m128 _coeff1_1;
  __m128 _coeff0_1;
  Mat *bottom_blob1_6;
  __m128 _p1_11;
  __m128 _p_11;
  int i_11;
  float *outptr_11;
  float *ptr_11;
  int q_11;
  Mat *bottom_blob2_5;
  size_t b_5;
  __m128 _p1_10;
  __m128 _p_10;
  int i_10;
  float *outptr_10;
  float *ptr1_5;
  float *ptr_10;
  int q_10;
  Mat *bottom_blob1_5;
  __m128 _p1_9;
  __m128 _p_9;
  int i_9;
  float *outptr_9;
  float *ptr_9;
  int q_9;
  Mat *bottom_blob2_4;
  size_t b_4;
  __m128 _p1_8;
  __m128 _p_8;
  int i_8;
  float *outptr_8;
  float *ptr1_4;
  float *ptr_8;
  int q_8;
  Mat *bottom_blob1_4;
  __m256 _p1_7;
  __m256 _p_7;
  int i_7;
  float *outptr_7;
  float *ptr_7;
  int q_7;
  Mat *bottom_blob2_3;
  size_t b_3;
  __m256 _p1_6;
  __m256 _p_6;
  int i_6;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  Mat *bottom_blob1_3;
  __m256 _p1_5;
  __m256 _p_5;
  int i_5;
  float *outptr_5;
  float *ptr_5;
  int q_5;
  __m256 _coeff;
  Mat *bottom_blob2_2;
  size_t b_2;
  __m256 _p1_4;
  __m256 _p_4;
  int i_4;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  __m256 _coeff1;
  __m256 _coeff0;
  Mat *bottom_blob1_2;
  __m256 _p1_3;
  __m256 _p_3;
  int i_3;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  Mat *bottom_blob2_1;
  size_t b_1;
  __m256 _p1_2;
  __m256 _p_2;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  Mat *bottom_blob1_1;
  __m256 _p1_1;
  __m256 _p_1;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  Mat *bottom_blob2;
  size_t b;
  __m256 _p1;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  Mat *bottom_blob1;
  Mat *top_blob;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *in_stack_ffffffffffffd7a8;
  Allocator *in_stack_ffffffffffffd7b8;
  Mat *in_stack_ffffffffffffd7c0;
  ulong uVar29;
  Mat *in_stack_ffffffffffffd7c8;
  int _c;
  Mat *in_stack_ffffffffffffd7d0;
  int local_2414;
  Mat local_2410;
  float *local_23c8;
  Mat local_23c0;
  float *local_2378;
  int local_236c;
  const_reference local_2368;
  ulong local_2360;
  int local_2354;
  Mat local_2350;
  Mat *local_2308;
  Mat local_2300;
  float *local_22b8;
  Mat local_22b0;
  float *local_2268;
  int local_225c;
  const_reference local_2258;
  int local_224c;
  Mat local_2248;
  float *local_2200;
  Mat local_21f8;
  float *local_21b0;
  int local_21a8;
  float local_21a4;
  const_reference local_21a0;
  ulong local_2198;
  int local_218c;
  Mat local_2188;
  float *local_2140;
  Mat local_2138;
  float *local_20f0;
  Mat local_20e8;
  float *local_20a0;
  int local_2094;
  float local_2090;
  float local_208c;
  const_reference local_2088;
  int local_207c;
  Mat local_2078;
  float *local_2030;
  Mat local_2028;
  float *local_1fe0;
  int local_1fd4;
  const_reference local_1fd0;
  ulong local_1fc8;
  int local_1fbc;
  Mat local_1fb8;
  float *local_1f70;
  Mat local_1f68;
  float *local_1f20;
  Mat local_1f18;
  float *local_1ed0;
  int local_1ec4;
  const_reference local_1ec0;
  int local_1eb4;
  Mat local_1eb0;
  float *local_1e68;
  Mat local_1e60;
  float *local_1e18;
  int local_1e0c;
  const_reference local_1e08;
  ulong local_1e00;
  int local_1df4;
  Mat local_1df0;
  float *local_1da8;
  Mat local_1da0;
  float *local_1d58;
  Mat local_1d50;
  float *local_1d08;
  int local_1cfc;
  const_reference local_1cf8;
  undefined8 local_1cf0;
  undefined8 uStack_1ce8;
  undefined1 local_1ce0 [16];
  int local_1ccc;
  Mat local_1cc8;
  undefined1 (*local_1c80) [16];
  Mat local_1c78;
  undefined1 (*local_1c30) [16];
  int local_1c24;
  const_reference local_1c20;
  ulong local_1c18;
  undefined8 local_1c10;
  undefined8 uStack_1c08;
  undefined1 local_1c00 [16];
  int local_1be4;
  Mat local_1be0;
  undefined1 (*local_1b98) [16];
  Mat local_1b90;
  undefined1 (*local_1b48) [16];
  Mat local_1b40;
  undefined1 (*local_1af8) [16];
  int local_1aec;
  const_reference local_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  float local_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  int local_1abc;
  Mat local_1ab8;
  undefined1 (*local_1a70) [16];
  Mat local_1a68;
  float *local_1a20;
  int local_1a14;
  undefined1 local_1a10 [16];
  const_reference local_1a00;
  ulong local_19f8;
  float local_19f0;
  float fStack_19ec;
  float fStack_19e8;
  float fStack_19e4;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  int local_19cc;
  Mat local_19c8;
  undefined1 (*local_1980) [16];
  Mat local_1978;
  float *local_1930;
  Mat local_1928;
  float *local_18e0;
  int local_18d4;
  undefined1 local_18d0 [16];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  const_reference local_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  float local_1890;
  float fStack_188c;
  float fStack_1888;
  float fStack_1884;
  int local_187c;
  Mat local_1878;
  undefined1 (*local_1830) [16];
  Mat local_1828;
  float *local_17e0;
  int local_17d4;
  const_reference local_17d0;
  ulong local_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  float local_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  int local_1794;
  Mat local_1790;
  undefined1 (*local_1748) [16];
  Mat local_1740;
  float *local_16f8;
  Mat local_16f0;
  undefined1 (*local_16a8) [12];
  int local_169c;
  const_reference local_1698;
  undefined8 local_1690;
  undefined8 uStack_1688;
  float local_1680;
  float fStack_167c;
  float fStack_1678;
  float fStack_1674;
  int local_166c;
  Mat local_1668;
  undefined1 (*local_1620) [16];
  Mat local_1618;
  float *local_15d0;
  int local_15c4;
  const_reference local_15c0;
  ulong local_15b8;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  int local_1584;
  Mat local_1580;
  undefined1 (*local_1538) [16];
  Mat local_1530;
  float *local_14e8;
  Mat local_14e0;
  undefined1 (*local_1498) [12];
  int local_148c;
  const_reference local_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined1 local_1460 [32];
  int local_143c;
  Mat local_1438;
  undefined1 (*local_13f0) [32];
  Mat local_13e8;
  undefined1 (*local_13a0) [32];
  int local_1394;
  const_reference local_1390;
  ulong local_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 local_1360 [32];
  int local_1324;
  Mat local_1320;
  undefined1 (*local_12d8) [32];
  Mat local_12d0;
  undefined1 (*local_1288) [32];
  Mat local_1280;
  undefined1 (*local_1238) [32];
  int local_122c;
  const_reference local_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 local_1200 [32];
  int local_11cc;
  Mat local_11c8;
  undefined1 (*local_1180) [32];
  Mat local_1178;
  undefined1 (*local_1130) [32];
  int local_1124;
  undefined1 local_1120 [32];
  const_reference local_10f0;
  ulong local_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined1 local_10c0 [8];
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  int local_109c;
  Mat local_1098;
  undefined1 (*local_1050) [32];
  Mat local_1048;
  undefined1 (*local_1000) [32];
  Mat local_ff8;
  undefined1 (*local_fb0) [24];
  int local_fa4;
  undefined1 local_fa0 [32];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  const_reference local_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  int local_efc;
  Mat local_ef8;
  undefined1 (*local_eb0) [32];
  Mat local_ea8;
  float *local_e60;
  int local_e54;
  const_reference local_e50;
  ulong local_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  int local_de4;
  Mat local_de0;
  undefined1 (*local_d98) [32];
  Mat local_d90;
  float *local_d48;
  Mat local_d40;
  float *local_cf8;
  int local_cec;
  const_reference local_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  int local_c9c;
  Mat local_c98;
  undefined1 (*local_c50) [32];
  Mat local_c48;
  float *local_c00;
  int local_bf4;
  const_reference local_bf0;
  ulong local_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  int local_b84;
  Mat local_b80;
  undefined1 (*local_b38) [32];
  Mat local_b30;
  float *local_ae8;
  Mat local_ad0;
  float *local_a88;
  int local_a7c;
  const_reference local_a78;
  reference local_a70;
  int local_a64;
  int local_a60;
  int local_a5c;
  int local_a58;
  int local_a54;
  const_reference local_a50;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a40;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a38;
  int local_a24;
  undefined1 (*local_a20) [32];
  undefined1 (*local_a18) [32];
  undefined1 (*local_a10) [32];
  undefined1 (*local_a08) [32];
  undefined1 (*local_a00) [32];
  undefined1 (*local_9f8) [32];
  undefined1 (*local_9f0) [32];
  undefined1 (*local_9e8) [24];
  float *local_9e0;
  undefined1 (*local_9d8) [32];
  float *local_9d0;
  float *local_9c8;
  float *local_9c0;
  undefined1 (*local_9b8) [32];
  float *local_9b0;
  float *local_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 (*local_8a8) [32];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 (*local_868) [32];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 (*local_828) [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 (*local_7e8) [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 (*local_7a8) [32];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 (*local_768) [32];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 (*local_728) [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 (*local_6e8) [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_64c;
  float local_648;
  float local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 (*local_500) [16];
  undefined1 (*local_4f8) [16];
  undefined1 (*local_4f0) [16];
  undefined1 (*local_4e8) [16];
  undefined1 (*local_4e0) [16];
  float *local_4d8;
  float *local_4d0;
  float *local_4c8;
  float *local_4c0;
  undefined1 (*local_4b8) [16];
  float *local_4b0;
  undefined1 (*local_4a8) [12];
  float *local_4a0;
  undefined1 (*local_498) [16];
  float *local_490;
  undefined1 (*local_488) [12];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_410 [8];
  float fStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [8];
  float fStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 (*local_3c8) [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 (*local_3a8) [16];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 (*local_388) [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined1 (*local_368) [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined1 (*local_348) [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 (*local_328) [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 (*local_308) [16];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 (*local_2e8) [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 local_2d0 [16];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2b0 [16];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined1 local_290 [8];
  float fStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_270 [8];
  float fStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float local_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float local_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float local_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  undefined1 local_180 [32];
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  undefined1 local_140 [32];
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_a40 = in_RDX;
  local_a38 = in_RSI;
  local_a50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_a54 = local_a50->w;
  local_a58 = local_a50->h;
  local_a5c = local_a50->c;
  local_a60 = local_a50->elempack;
  local_a64 = local_a54 * local_a58;
  local_a70 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a40,0);
  ncnn::Mat::create_like
            (in_stack_ffffffffffffd7c8,in_stack_ffffffffffffd7c0,in_stack_ffffffffffffd7b8);
  bVar22 = ncnn::Mat::empty(in_stack_ffffffffffffd7a8);
  if (bVar22) {
    local_a24 = -100;
  }
  else if (local_a60 == 8) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_a78 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
      for (local_a7c = 0; local_a7c < local_a5c; local_a7c = local_a7c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_ad0);
        ncnn::Mat::~Mat((Mat *)0x37fa52);
        local_a88 = pfVar23;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_b30);
        ncnn::Mat::~Mat((Mat *)0x37faaa);
        local_ae8 = pfVar23;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_b80);
        ncnn::Mat::~Mat((Mat *)0x37fb02);
        local_b38 = pauVar24;
        for (local_b84 = 0; local_b84 < local_a64; local_b84 = local_b84 + 1) {
          local_9a8 = local_a88;
          uVar3 = *(undefined8 *)local_a88;
          uVar4 = *(undefined8 *)(local_a88 + 2);
          uVar5 = *(undefined8 *)(local_a88 + 4);
          uVar6 = *(undefined8 *)(local_a88 + 6);
          local_9b0 = local_ae8;
          local_be0 = *(undefined8 *)local_ae8;
          uStack_bd8 = *(undefined8 *)(local_ae8 + 2);
          uStack_bd0 = *(undefined8 *)(local_ae8 + 4);
          uStack_bc8 = *(undefined8 *)(local_ae8 + 6);
          local_900._0_4_ = (float)uVar3;
          local_900._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_8f8._0_4_ = (float)uVar4;
          uStack_8f8._4_4_ = (float)((ulong)uVar4 >> 0x20);
          uStack_8f0._0_4_ = (float)uVar5;
          uStack_8f0._4_4_ = (float)((ulong)uVar5 >> 0x20);
          uStack_8e8._0_4_ = (float)uVar6;
          uStack_8e8._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
          local_920._0_4_ = (float)local_be0;
          local_920._4_4_ = (float)((ulong)local_be0 >> 0x20);
          uStack_918._0_4_ = (float)uStack_bd8;
          uStack_918._4_4_ = (float)((ulong)uStack_bd8 >> 0x20);
          uStack_910._0_4_ = (float)uStack_bd0;
          uStack_910._4_4_ = (float)((ulong)uStack_bd0 >> 0x20);
          uStack_908._0_4_ = (float)uStack_bc8;
          local_bc0 = CONCAT44(local_900._4_4_ * local_920._4_4_,(float)local_900 * (float)local_920
                              );
          uStack_bb8 = CONCAT44(uStack_8f8._4_4_ * uStack_918._4_4_,
                                (float)uStack_8f8 * (float)uStack_918);
          uStack_bb0 = CONCAT44(uStack_8f0._4_4_ * uStack_910._4_4_,
                                (float)uStack_8f0 * (float)uStack_910);
          uStack_ba8 = CONCAT44(uStack_8e8._4_4_,(float)uStack_8e8 * (float)uStack_908);
          local_6e8 = local_b38;
          local_720 = local_bc0;
          uStack_718 = uStack_bb8;
          uStack_710 = uStack_bb0;
          uStack_708 = uStack_ba8;
          auVar13._8_8_ = uStack_bb8;
          auVar13._0_8_ = local_bc0;
          auVar13._16_8_ = uStack_bb0;
          auVar13._24_8_ = uStack_ba8;
          *local_b38 = auVar13;
          local_a88 = local_a88 + 8;
          local_ae8 = local_ae8 + 8;
          local_b38 = local_b38 + 1;
          local_920 = local_be0;
          uStack_918 = uStack_bd8;
          uStack_910 = uStack_bd0;
          uStack_908 = uStack_bc8;
          local_900 = uVar3;
          uStack_8f8 = uVar4;
          uStack_8f0 = uVar5;
          uStack_8e8 = uVar6;
        }
      }
      for (local_be8 = 2; uVar29 = local_be8,
          sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
          uVar29 < sVar25; local_be8 = local_be8 + 1) {
        local_bf0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_a38,local_be8);
        for (local_bf4 = 0; local_bf4 < local_a5c; local_bf4 = local_bf4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_c48);
          ncnn::Mat::~Mat((Mat *)0x37fd94);
          local_c00 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_c98);
          ncnn::Mat::~Mat((Mat *)0x37fdec);
          local_c50 = pauVar24;
          for (local_c9c = 0; local_c9c < local_a64; local_c9c = local_c9c + 1) {
            local_9b8 = local_c50;
            uVar3 = *(undefined8 *)*local_c50;
            uVar4 = *(undefined8 *)(*local_c50 + 8);
            uVar5 = *(undefined8 *)(*local_c50 + 0x10);
            uVar6 = *(undefined8 *)(*local_c50 + 0x18);
            local_9c0 = local_c00;
            local_ce0 = *(undefined8 *)local_c00;
            uStack_cd8 = *(undefined8 *)(local_c00 + 2);
            uStack_cd0 = *(undefined8 *)(local_c00 + 4);
            uStack_cc8 = *(undefined8 *)(local_c00 + 6);
            local_940._0_4_ = (float)uVar3;
            local_940._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_938._0_4_ = (float)uVar4;
            uStack_938._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_930._0_4_ = (float)uVar5;
            uStack_930._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_928._0_4_ = (float)uVar6;
            uStack_928._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
            local_960._0_4_ = (float)local_ce0;
            local_960._4_4_ = (float)((ulong)local_ce0 >> 0x20);
            uStack_958._0_4_ = (float)uStack_cd8;
            uStack_958._4_4_ = (float)((ulong)uStack_cd8 >> 0x20);
            uStack_950._0_4_ = (float)uStack_cd0;
            uStack_950._4_4_ = (float)((ulong)uStack_cd0 >> 0x20);
            uStack_948._0_4_ = (float)uStack_cc8;
            local_cc0 = CONCAT44(local_940._4_4_ * local_960._4_4_,
                                 (float)local_940 * (float)local_960);
            uStack_cb8 = CONCAT44(uStack_938._4_4_ * uStack_958._4_4_,
                                  (float)uStack_938 * (float)uStack_958);
            uStack_cb0 = CONCAT44(uStack_930._4_4_ * uStack_950._4_4_,
                                  (float)uStack_930 * (float)uStack_950);
            uStack_ca8 = CONCAT44(uStack_928._4_4_,(float)uStack_928 * (float)uStack_948);
            local_728 = local_c50;
            local_760 = local_cc0;
            uStack_758 = uStack_cb8;
            uStack_750 = uStack_cb0;
            uStack_748 = uStack_ca8;
            auVar12._8_8_ = uStack_cb8;
            auVar12._0_8_ = local_cc0;
            auVar12._16_8_ = uStack_cb0;
            auVar12._24_8_ = uStack_ca8;
            *local_c50 = auVar12;
            local_c00 = local_c00 + 8;
            local_c50 = local_c50 + 1;
            local_960 = local_ce0;
            uStack_958 = uStack_cd8;
            uStack_950 = uStack_cd0;
            uStack_948 = uStack_cc8;
            local_940 = uVar3;
            uStack_938 = uVar4;
            uStack_930 = uVar5;
            uStack_928 = uVar6;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_ce8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
        for (local_cec = 0; local_cec < local_a5c; local_cec = local_cec + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_d40);
          ncnn::Mat::~Mat((Mat *)0x380058);
          local_cf8 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_d90);
          ncnn::Mat::~Mat((Mat *)0x3800b0);
          local_d48 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_de0);
          ncnn::Mat::~Mat((Mat *)0x380108);
          local_d98 = pauVar24;
          for (local_de4 = 0; local_de4 < local_a64; local_de4 = local_de4 + 1) {
            local_9c8 = local_cf8;
            uVar3 = *(undefined8 *)local_cf8;
            uVar4 = *(undefined8 *)(local_cf8 + 2);
            uVar5 = *(undefined8 *)(local_cf8 + 4);
            uVar6 = *(undefined8 *)(local_cf8 + 6);
            local_9d0 = local_d48;
            local_e40 = *(undefined8 *)local_d48;
            uStack_e38 = *(undefined8 *)(local_d48 + 2);
            uStack_e30 = *(undefined8 *)(local_d48 + 4);
            uStack_e28 = *(undefined8 *)(local_d48 + 6);
            local_680._0_4_ = (float)uVar3;
            local_680._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_678._0_4_ = (float)uVar4;
            uStack_678._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_670._0_4_ = (float)uVar5;
            uStack_670._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_668._0_4_ = (float)uVar6;
            uStack_668._4_4_ = (float)((ulong)uVar6 >> 0x20);
            local_6a0._0_4_ = (float)local_e40;
            local_6a0._4_4_ = (float)((ulong)local_e40 >> 0x20);
            uStack_698._0_4_ = (float)uStack_e38;
            uStack_698._4_4_ = (float)((ulong)uStack_e38 >> 0x20);
            uStack_690._0_4_ = (float)uStack_e30;
            uStack_690._4_4_ = (float)((ulong)uStack_e30 >> 0x20);
            uStack_688._0_4_ = (float)uStack_e28;
            uStack_688._4_4_ = (float)((ulong)uStack_e28 >> 0x20);
            local_e20 = CONCAT44(local_680._4_4_ + local_6a0._4_4_,
                                 (float)local_680 + (float)local_6a0);
            uStack_e18 = CONCAT44(uStack_678._4_4_ + uStack_698._4_4_,
                                  (float)uStack_678 + (float)uStack_698);
            uStack_e10 = CONCAT44(uStack_670._4_4_ + uStack_690._4_4_,
                                  (float)uStack_670 + (float)uStack_690);
            uStack_e08 = CONCAT44(uStack_668._4_4_ + uStack_688._4_4_,
                                  (float)uStack_668 + (float)uStack_688);
            local_768 = local_d98;
            local_7a0 = local_e20;
            uStack_798 = uStack_e18;
            uStack_790 = uStack_e10;
            uStack_788 = uStack_e08;
            auVar11._8_8_ = uStack_e18;
            auVar11._0_8_ = local_e20;
            auVar11._16_8_ = uStack_e10;
            auVar11._24_8_ = uStack_e08;
            *local_d98 = auVar11;
            local_cf8 = local_cf8 + 8;
            local_d48 = local_d48 + 8;
            local_d98 = local_d98 + 1;
            local_6a0 = local_e40;
            uStack_698 = uStack_e38;
            uStack_690 = uStack_e30;
            uStack_688 = uStack_e28;
            local_680 = uVar3;
            uStack_678 = uVar4;
            uStack_670 = uVar5;
            uStack_668 = uVar6;
          }
        }
        for (local_e48 = 2; uVar29 = local_e48,
            sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
            uVar29 < sVar25; local_e48 = local_e48 + 1) {
          local_e50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_a38,local_e48);
          for (local_e54 = 0; local_e54 < local_a5c; local_e54 = local_e54 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_ea8);
            ncnn::Mat::~Mat((Mat *)0x38039a);
            local_e60 = pfVar23;
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_ef8);
            ncnn::Mat::~Mat((Mat *)0x3803f2);
            local_eb0 = pauVar24;
            for (local_efc = 0; local_efc < local_a64; local_efc = local_efc + 1) {
              local_9d8 = local_eb0;
              uVar3 = *(undefined8 *)*local_eb0;
              uVar4 = *(undefined8 *)(*local_eb0 + 8);
              uVar5 = *(undefined8 *)(*local_eb0 + 0x10);
              uVar6 = *(undefined8 *)(*local_eb0 + 0x18);
              local_9e0 = local_e60;
              local_f40 = *(undefined8 *)local_e60;
              uStack_f38 = *(undefined8 *)(local_e60 + 2);
              uStack_f30 = *(undefined8 *)(local_e60 + 4);
              uStack_f28 = *(undefined8 *)(local_e60 + 6);
              local_6c0._0_4_ = (float)uVar3;
              local_6c0._4_4_ = (float)((ulong)uVar3 >> 0x20);
              uStack_6b8._0_4_ = (float)uVar4;
              uStack_6b8._4_4_ = (float)((ulong)uVar4 >> 0x20);
              uStack_6b0._0_4_ = (float)uVar5;
              uStack_6b0._4_4_ = (float)((ulong)uVar5 >> 0x20);
              uStack_6a8._0_4_ = (float)uVar6;
              uStack_6a8._4_4_ = (float)((ulong)uVar6 >> 0x20);
              local_6e0._0_4_ = (float)local_f40;
              local_6e0._4_4_ = (float)((ulong)local_f40 >> 0x20);
              uStack_6d8._0_4_ = (float)uStack_f38;
              uStack_6d8._4_4_ = (float)((ulong)uStack_f38 >> 0x20);
              uStack_6d0._0_4_ = (float)uStack_f30;
              uStack_6d0._4_4_ = (float)((ulong)uStack_f30 >> 0x20);
              uStack_6c8._0_4_ = (float)uStack_f28;
              uStack_6c8._4_4_ = (float)((ulong)uStack_f28 >> 0x20);
              local_f20 = CONCAT44(local_6c0._4_4_ + local_6e0._4_4_,
                                   (float)local_6c0 + (float)local_6e0);
              uStack_f18 = CONCAT44(uStack_6b8._4_4_ + uStack_6d8._4_4_,
                                    (float)uStack_6b8 + (float)uStack_6d8);
              uStack_f10 = CONCAT44(uStack_6b0._4_4_ + uStack_6d0._4_4_,
                                    (float)uStack_6b0 + (float)uStack_6d0);
              uStack_f08 = CONCAT44(uStack_6a8._4_4_ + uStack_6c8._4_4_,
                                    (float)uStack_6a8 + (float)uStack_6c8);
              local_7a8 = local_eb0;
              local_7e0 = local_f20;
              uStack_7d8 = uStack_f18;
              uStack_7d0 = uStack_f10;
              uStack_7c8 = uStack_f08;
              auVar10._8_8_ = uStack_f18;
              auVar10._0_8_ = local_f20;
              auVar10._16_8_ = uStack_f10;
              auVar10._24_8_ = uStack_f08;
              *local_eb0 = auVar10;
              local_e60 = local_e60 + 8;
              local_eb0 = local_eb0 + 1;
              local_6e0 = local_f40;
              uStack_6d8 = uStack_f38;
              uStack_6d0 = uStack_f30;
              uStack_6c8 = uStack_f28;
              local_6c0 = uVar3;
              uStack_6b8 = uVar4;
              uStack_6b0 = uVar5;
              uStack_6a8 = uVar6;
            }
          }
        }
      }
      else {
        local_f48 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
        pfVar23 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0)
        ;
        local_644 = *pfVar23;
        auVar1 = vinsertps_avx(ZEXT416((uint)local_644),ZEXT416((uint)local_644),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_644),0x20);
        local_1c0 = vinsertps_avx(auVar1,ZEXT416((uint)local_644),0x30);
        auVar1 = vinsertps_avx(ZEXT416((uint)local_644),ZEXT416((uint)local_644),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_644),0x20);
        auStack_1b0 = vinsertps_avx(auVar1,ZEXT416((uint)local_644),0x30);
        local_f80 = local_1c0._0_8_;
        uStack_f78 = local_1c0._8_8_;
        uStack_f70 = auStack_1b0._0_8_;
        uStack_f68 = auStack_1b0._8_8_;
        local_1a0 = local_644;
        local_19c = local_644;
        local_198 = local_644;
        local_194 = local_644;
        local_190 = local_644;
        local_18c = local_644;
        local_188 = local_644;
        local_184 = local_644;
        pfVar23 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),1)
        ;
        local_648 = *pfVar23;
        auVar1 = vinsertps_avx(ZEXT416((uint)local_648),ZEXT416((uint)local_648),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_648),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_648),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)local_648),ZEXT416((uint)local_648),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_648),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_648),0x30);
        local_fa0._16_16_ = auVar1;
        local_fa0._0_16_ = auVar2;
        local_180 = local_fa0;
        local_160 = local_648;
        local_15c = local_648;
        local_158 = local_648;
        local_154 = local_648;
        local_150 = local_648;
        local_14c = local_648;
        local_148 = local_648;
        local_144 = local_648;
        for (local_fa4 = 0; local_fa4 < local_a5c; local_fa4 = local_fa4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar26 = (undefined1 (*) [24])ncnn::Mat::operator_cast_to_float_(&local_ff8);
          ncnn::Mat::~Mat((Mat *)0x38086b);
          local_fb0 = pauVar26;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1048);
          ncnn::Mat::~Mat((Mat *)0x3808c3);
          local_1000 = pauVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1098);
          ncnn::Mat::~Mat((Mat *)0x38091b);
          local_1050 = pauVar24;
          for (local_109c = 0; local_109c < local_a64; local_109c = local_109c + 1) {
            local_9e8 = local_fb0;
            auVar21 = *local_fb0;
            uVar3 = *(undefined8 *)local_fb0[1];
            local_9f0 = local_1000;
            local_10e0 = *(undefined8 *)*local_1000;
            uStack_10d8 = *(undefined8 *)(*local_1000 + 8);
            uStack_10d0 = *(undefined8 *)(*local_1000 + 0x10);
            uStack_10c8 = *(undefined8 *)(*local_1000 + 0x18);
            local_10c0 = auVar21._0_8_;
            uVar4 = local_10c0;
            uStack_10b8 = auVar21._8_8_;
            uVar5 = uStack_10b8;
            uStack_10b0 = auVar21._16_8_;
            uVar6 = uStack_10b0;
            local_980._0_4_ = auVar21._0_4_;
            local_980._4_4_ = auVar21._4_4_;
            uStack_978._0_4_ = auVar21._8_4_;
            uStack_978._4_4_ = auVar21._12_4_;
            uStack_970._0_4_ = auVar21._16_4_;
            uStack_970._4_4_ = auVar21._20_4_;
            uStack_968._0_4_ = (float)uVar3;
            uStack_968._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
            local_9a0._0_4_ = (float)local_f80;
            local_9a0._4_4_ = (float)((ulong)local_f80 >> 0x20);
            uStack_998._0_4_ = (float)uStack_f78;
            uStack_998._4_4_ = (float)((ulong)uStack_f78 >> 0x20);
            uStack_990._0_4_ = (float)uStack_f70;
            uStack_990._4_4_ = (float)((ulong)uStack_f70 >> 0x20);
            uStack_988._0_4_ = (float)uStack_f68;
            local_10c0._4_4_ = local_980._4_4_ * local_9a0._4_4_;
            local_10c0._0_4_ = (float)local_980 * (float)local_9a0;
            uStack_10b8._0_4_ = (float)uStack_978 * (float)uStack_998;
            uStack_10b8._4_4_ = uStack_978._4_4_ * uStack_998._4_4_;
            uStack_10b0._0_4_ = (float)uStack_970 * (float)uStack_990;
            uStack_10b0._4_4_ = uStack_970._4_4_ * uStack_990._4_4_;
            auVar21 = _local_10c0;
            uStack_10a8._0_4_ = (float)uStack_968 * (float)uStack_988;
            uStack_10a8._4_4_ = uStack_968._4_4_;
            auVar13 = _local_10c0;
            local_5c0 = local_fa0._0_8_;
            uStack_5b8 = local_fa0._8_8_;
            uStack_5b0 = local_fa0._16_8_;
            uStack_5a8 = local_fa0._24_8_;
            local_5e0 = local_10c0;
            uStack_5d8 = uStack_10b8;
            uStack_10b0 = auVar21._16_8_;
            uStack_5d0 = uStack_10b0;
            uStack_10a8 = auVar13._24_8_;
            uStack_5c8 = uStack_10a8;
            local_e0 = local_fa0._0_8_;
            uStack_d8 = local_fa0._8_8_;
            uStack_d0 = local_fa0._16_8_;
            uStack_c8 = local_fa0._24_8_;
            local_100 = local_10c0;
            uStack_f8 = uStack_10b8;
            uStack_f0 = uStack_10b0;
            uStack_e8 = uStack_10a8;
            auVar19._16_8_ = uStack_10b0;
            auVar19._0_16_ = _local_10c0;
            auVar19._24_8_ = uStack_10a8;
            auVar1 = vfmadd213ps_fma(local_fa0,*local_1000,auVar19);
            local_7e8 = local_1050;
            local_10c0 = auVar1._0_8_;
            local_820 = local_10c0;
            uStack_10b8 = auVar1._8_8_;
            uStack_818 = uStack_10b8;
            uStack_810 = 0;
            uStack_808 = 0;
            *local_1050 = ZEXT1632(auVar1);
            local_fb0 = (undefined1 (*) [24])(local_fb0[1] + 8);
            local_1000 = local_1000 + 1;
            local_1050 = local_1050 + 1;
            _local_10c0 = ZEXT1632(auVar1);
            local_9a0 = local_f80;
            uStack_998 = uStack_f78;
            uStack_990 = uStack_f70;
            uStack_988 = uStack_f68;
            local_980 = uVar4;
            uStack_978 = uVar5;
            uStack_970 = uVar6;
            uStack_968 = uVar3;
            local_5a0 = local_10e0;
            uStack_598 = uStack_10d8;
            uStack_590 = uStack_10d0;
            uStack_588 = uStack_10c8;
            local_c0 = local_10e0;
            uStack_b8 = uStack_10d8;
            uStack_b0 = uStack_10d0;
            uStack_a8 = uStack_10c8;
          }
        }
        for (local_10e8 = 2; uVar29 = local_10e8,
            sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
            uVar29 < sVar25; local_10e8 = local_10e8 + 1) {
          local_10f0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_a38,local_10e8);
          pfVar23 = ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),local_10e8)
          ;
          local_64c = *pfVar23;
          auVar1 = vinsertps_avx(ZEXT416((uint)local_64c),ZEXT416((uint)local_64c),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_64c),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_64c),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)local_64c),ZEXT416((uint)local_64c),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_64c),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_64c),0x30);
          local_1120._16_16_ = auVar1;
          local_1120._0_16_ = auVar2;
          local_140 = local_1120;
          local_120 = local_64c;
          local_11c = local_64c;
          local_118 = local_64c;
          local_114 = local_64c;
          local_110 = local_64c;
          local_10c = local_64c;
          local_108 = local_64c;
          local_104 = local_64c;
          for (local_1124 = 0; local_1124 < local_a5c; local_1124 = local_1124 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1178);
            ncnn::Mat::~Mat((Mat *)0x380d61);
            local_1130 = pauVar24;
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_11c8);
            ncnn::Mat::~Mat((Mat *)0x380db9);
            local_1180 = pauVar24;
            for (local_11cc = 0; local_11cc < local_a64; local_11cc = local_11cc + 1) {
              local_9f8 = local_1180;
              auVar21 = *(undefined1 (*) [24])*local_1180;
              uStack_628 = *(undefined8 *)(*local_1180 + 0x18);
              local_a00 = local_1130;
              local_1220 = *(undefined8 *)*local_1130;
              uStack_1218 = *(undefined8 *)(*local_1130 + 8);
              uStack_1210 = *(undefined8 *)(*local_1130 + 0x10);
              uStack_1208 = *(undefined8 *)(*local_1130 + 0x18);
              local_620 = local_1120._0_8_;
              uStack_618 = local_1120._8_8_;
              uStack_610 = local_1120._16_8_;
              uStack_608 = local_1120._24_8_;
              local_1200._0_8_ = auVar21._0_8_;
              local_640 = local_1200._0_8_;
              local_1200._8_8_ = auVar21._8_8_;
              uStack_638 = local_1200._8_8_;
              local_1200._16_8_ = auVar21._16_8_;
              uStack_630 = local_1200._16_8_;
              local_80 = local_1120._0_8_;
              uStack_78 = local_1120._8_8_;
              uStack_70 = local_1120._16_8_;
              uStack_68 = local_1120._24_8_;
              local_a0 = local_1200._0_8_;
              uStack_98 = local_1200._8_8_;
              uStack_90 = local_1200._16_8_;
              auVar1 = vfmadd213ps_fma(local_1120,*local_1130,*local_1180);
              local_828 = local_1180;
              local_1200._0_8_ = auVar1._0_8_;
              local_860 = local_1200._0_8_;
              local_1200._8_8_ = auVar1._8_8_;
              uStack_858 = local_1200._8_8_;
              uStack_850 = 0;
              uStack_848 = 0;
              *local_1180 = ZEXT1632(auVar1);
              local_1130 = local_1130 + 1;
              local_1180 = local_1180 + 1;
              local_1200 = ZEXT1632(auVar1);
              local_600 = local_1220;
              uStack_5f8 = uStack_1218;
              uStack_5f0 = uStack_1210;
              uStack_5e8 = uStack_1208;
              uStack_88 = uStack_628;
              local_60 = local_1220;
              uStack_58 = uStack_1218;
              uStack_50 = uStack_1210;
              uStack_48 = uStack_1208;
            }
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_1228 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
      for (local_122c = 0; local_122c < local_a5c; local_122c = local_122c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1280);
        ncnn::Mat::~Mat((Mat *)0x381060);
        local_1238 = pauVar24;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_12d0);
        ncnn::Mat::~Mat((Mat *)0x3810b8);
        local_1288 = pauVar24;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1320);
        ncnn::Mat::~Mat((Mat *)0x381110);
        local_12d8 = pauVar24;
        for (local_1324 = 0; local_1324 < local_a64; local_1324 = local_1324 + 1) {
          local_a08 = local_1238;
          auVar21 = *(undefined1 (*) [24])*local_1238;
          uStack_508 = *(undefined8 *)(*local_1238 + 0x18);
          local_a10 = local_1288;
          local_1380 = *(undefined8 *)*local_1288;
          uStack_1378 = *(undefined8 *)(*local_1288 + 8);
          uStack_1370 = *(undefined8 *)(*local_1288 + 0x10);
          uStack_1368 = *(undefined8 *)(*local_1288 + 0x18);
          local_1360._0_8_ = auVar21._0_8_;
          local_520 = local_1360._0_8_;
          local_1360._8_8_ = auVar21._8_8_;
          uStack_518 = local_1360._8_8_;
          local_1360._16_8_ = auVar21._16_8_;
          uStack_510 = local_1360._16_8_;
          local_1360 = vmaxps_avx(*local_1238,*local_1288);
          local_868 = local_12d8;
          local_8a0 = local_1360._0_8_;
          uStack_898 = local_1360._8_8_;
          uStack_890 = local_1360._16_8_;
          uStack_888 = local_1360._24_8_;
          *local_12d8 = local_1360;
          local_1238 = local_1238 + 1;
          local_1288 = local_1288 + 1;
          local_12d8 = local_12d8 + 1;
          local_540 = local_1380;
          uStack_538 = uStack_1378;
          uStack_530 = uStack_1370;
          uStack_528 = uStack_1368;
        }
      }
      for (local_1388 = 2; uVar29 = local_1388,
          sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
          uVar29 < sVar25; local_1388 = local_1388 + 1) {
        local_1390 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_a38,local_1388);
        for (local_1394 = 0; local_1394 < local_a5c; local_1394 = local_1394 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_13e8);
          ncnn::Mat::~Mat((Mat *)0x3813a6);
          local_13a0 = pauVar24;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar24 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1438);
          ncnn::Mat::~Mat((Mat *)0x3813fe);
          local_13f0 = pauVar24;
          for (local_143c = 0; local_143c < local_a64; local_143c = local_143c + 1) {
            local_a18 = local_13f0;
            auVar21 = *(undefined1 (*) [24])*local_13f0;
            uStack_548 = *(undefined8 *)(*local_13f0 + 0x18);
            local_a20 = local_13a0;
            local_1480 = *(undefined8 *)*local_13a0;
            uStack_1478 = *(undefined8 *)(*local_13a0 + 8);
            uStack_1470 = *(undefined8 *)(*local_13a0 + 0x10);
            uStack_1468 = *(undefined8 *)(*local_13a0 + 0x18);
            local_1460._0_8_ = auVar21._0_8_;
            local_560 = local_1460._0_8_;
            local_1460._8_8_ = auVar21._8_8_;
            uStack_558 = local_1460._8_8_;
            local_1460._16_8_ = auVar21._16_8_;
            uStack_550 = local_1460._16_8_;
            local_1460 = vmaxps_avx(*local_13f0,*local_13a0);
            local_8a8 = local_13f0;
            local_8e0 = local_1460._0_8_;
            uStack_8d8 = local_1460._8_8_;
            uStack_8d0 = local_1460._16_8_;
            uStack_8c8 = local_1460._24_8_;
            *local_13f0 = local_1460;
            local_13a0 = local_13a0 + 1;
            local_13f0 = local_13f0 + 1;
            local_580 = local_1480;
            uStack_578 = uStack_1478;
            uStack_570 = uStack_1470;
            uStack_568 = uStack_1468;
          }
        }
      }
    }
    local_a24 = 0;
  }
  else if (local_a60 == 4) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_1488 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
      for (local_148c = 0; local_148c < local_a5c; local_148c = local_148c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pauVar27 = (undefined1 (*) [12])ncnn::Mat::operator_cast_to_float_(&local_14e0);
        ncnn::Mat::~Mat((Mat *)0x38166c);
        local_1498 = pauVar27;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1530);
        ncnn::Mat::~Mat((Mat *)0x3816c4);
        local_14e8 = pfVar23;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1580);
        ncnn::Mat::~Mat((Mat *)0x38171c);
        local_1538 = pauVar28;
        for (local_1584 = 0; local_1584 < local_a64; local_1584 = local_1584 + 1) {
          local_488 = local_1498;
          auVar20 = *local_1498;
          fStack_1594 = (float)((ulong)*(undefined8 *)(*local_1498 + 8) >> 0x20);
          local_490 = local_14e8;
          local_15b0 = *(undefined8 *)local_14e8;
          uStack_15a8 = *(undefined8 *)(local_14e8 + 2);
          auVar1._12_4_ = fStack_1594;
          auVar1._0_12_ = auVar20;
          local_3f0._0_4_ = auVar20._0_4_;
          local_3f0._4_4_ = auVar20._4_4_;
          fStack_3e8 = auVar20._8_4_;
          local_400._0_4_ = (float)local_15b0;
          local_400._4_4_ = (float)((ulong)local_15b0 >> 0x20);
          uStack_3f8._0_4_ = (float)uStack_15a8;
          uStack_3f8._4_4_ = (float)((ulong)uStack_15a8 >> 0x20);
          local_15a0 = (float)local_3f0._0_4_ * (float)local_400;
          fStack_159c = (float)local_3f0._4_4_ * local_400._4_4_;
          fStack_1598 = fStack_3e8 * (float)uStack_3f8;
          fStack_1594 = fStack_1594 * uStack_3f8._4_4_;
          local_2e8 = local_1538;
          local_300 = CONCAT44(fStack_159c,local_15a0);
          uStack_2f8 = CONCAT44(fStack_1594,fStack_1598);
          auVar2._8_8_ = uStack_2f8;
          auVar2._0_8_ = local_300;
          *local_1538 = auVar2;
          local_1498 = (undefined1 (*) [12])(local_1498[1] + 4);
          local_14e8 = local_14e8 + 4;
          local_1538 = local_1538 + 1;
          local_400 = local_15b0;
          uStack_3f8 = uStack_15a8;
          _local_3f0 = auVar1;
        }
      }
      for (local_15b8 = 2; uVar29 = local_15b8,
          sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
          uVar29 < sVar25; local_15b8 = local_15b8 + 1) {
        local_15c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_a38,local_15b8);
        for (local_15c4 = 0; local_15c4 < local_a5c; local_15c4 = local_15c4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1618);
          ncnn::Mat::~Mat((Mat *)0x3819a8);
          local_15d0 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1668);
          ncnn::Mat::~Mat((Mat *)0x381a00);
          local_1620 = pauVar28;
          for (local_166c = 0; local_166c < local_a64; local_166c = local_166c + 1) {
            local_498 = local_1620;
            auVar20 = *(undefined1 (*) [12])*local_1620;
            fStack_1674 = (float)((ulong)*(undefined8 *)(*local_1620 + 8) >> 0x20);
            local_4a0 = local_15d0;
            local_1690 = *(undefined8 *)local_15d0;
            uStack_1688 = *(undefined8 *)(local_15d0 + 2);
            auVar9._12_4_ = fStack_1674;
            auVar9._0_12_ = auVar20;
            local_410._0_4_ = auVar20._0_4_;
            local_410._4_4_ = auVar20._4_4_;
            fStack_408 = auVar20._8_4_;
            local_420._0_4_ = (float)local_1690;
            local_420._4_4_ = (float)((ulong)local_1690 >> 0x20);
            uStack_418._0_4_ = (float)uStack_1688;
            uStack_418._4_4_ = (float)((ulong)uStack_1688 >> 0x20);
            local_1680 = (float)local_410._0_4_ * (float)local_420;
            fStack_167c = (float)local_410._4_4_ * local_420._4_4_;
            fStack_1678 = fStack_408 * (float)uStack_418;
            fStack_1674 = fStack_1674 * uStack_418._4_4_;
            local_308 = local_1620;
            local_320 = CONCAT44(fStack_167c,local_1680);
            uStack_318 = CONCAT44(fStack_1674,fStack_1678);
            auVar18._8_8_ = uStack_318;
            auVar18._0_8_ = local_320;
            *local_1620 = auVar18;
            local_15d0 = local_15d0 + 4;
            local_1620 = local_1620 + 1;
            local_420 = local_1690;
            uStack_418 = uStack_1688;
            _local_410 = auVar9;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_1698 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
        for (local_169c = 0; local_169c < local_a5c; local_169c = local_169c + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar27 = (undefined1 (*) [12])ncnn::Mat::operator_cast_to_float_(&local_16f0);
          ncnn::Mat::~Mat((Mat *)0x381c69);
          local_16a8 = pauVar27;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1740);
          ncnn::Mat::~Mat((Mat *)0x381cc1);
          local_16f8 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1790);
          ncnn::Mat::~Mat((Mat *)0x381d19);
          local_1748 = pauVar28;
          for (local_1794 = 0; local_1794 < local_a64; local_1794 = local_1794 + 1) {
            local_4a8 = local_16a8;
            auVar20 = *local_16a8;
            fStack_17a4 = (float)((ulong)*(undefined8 *)(*local_16a8 + 8) >> 0x20);
            local_4b0 = local_16f8;
            local_17c0 = *(undefined8 *)local_16f8;
            uStack_17b8 = *(undefined8 *)(local_16f8 + 2);
            auVar8._12_4_ = fStack_17a4;
            auVar8._0_12_ = auVar20;
            local_270._0_4_ = auVar20._0_4_;
            local_270._4_4_ = auVar20._4_4_;
            fStack_268 = auVar20._8_4_;
            local_280._0_4_ = (float)local_17c0;
            local_280._4_4_ = (float)((ulong)local_17c0 >> 0x20);
            uStack_278._0_4_ = (float)uStack_17b8;
            uStack_278._4_4_ = (float)((ulong)uStack_17b8 >> 0x20);
            local_17b0 = (float)local_270._0_4_ + (float)local_280;
            fStack_17ac = (float)local_270._4_4_ + local_280._4_4_;
            fStack_17a8 = fStack_268 + (float)uStack_278;
            fStack_17a4 = fStack_17a4 + uStack_278._4_4_;
            local_328 = local_1748;
            local_340 = CONCAT44(fStack_17ac,local_17b0);
            uStack_338 = CONCAT44(fStack_17a4,fStack_17a8);
            auVar17._8_8_ = uStack_338;
            auVar17._0_8_ = local_340;
            *local_1748 = auVar17;
            local_16a8 = (undefined1 (*) [12])(local_16a8[1] + 4);
            local_16f8 = local_16f8 + 4;
            local_1748 = local_1748 + 1;
            local_280 = local_17c0;
            uStack_278 = uStack_17b8;
            _local_270 = auVar8;
          }
        }
        for (local_17c8 = 2; uVar29 = local_17c8,
            sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
            uVar29 < sVar25; local_17c8 = local_17c8 + 1) {
          local_17d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_a38,local_17c8);
          for (local_17d4 = 0; local_17d4 < local_a5c; local_17d4 = local_17d4 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1828);
            ncnn::Mat::~Mat((Mat *)0x381fa5);
            local_17e0 = pfVar23;
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1878);
            ncnn::Mat::~Mat((Mat *)0x381ffd);
            local_1830 = pauVar28;
            for (local_187c = 0; local_187c < local_a64; local_187c = local_187c + 1) {
              local_4b8 = local_1830;
              auVar20 = *(undefined1 (*) [12])*local_1830;
              fStack_1884 = (float)((ulong)*(undefined8 *)(*local_1830 + 8) >> 0x20);
              local_4c0 = local_17e0;
              local_18a0 = *(undefined8 *)local_17e0;
              uStack_1898 = *(undefined8 *)(local_17e0 + 2);
              auVar7._12_4_ = fStack_1884;
              auVar7._0_12_ = auVar20;
              local_290._0_4_ = auVar20._0_4_;
              local_290._4_4_ = auVar20._4_4_;
              fStack_288 = auVar20._8_4_;
              local_2a0._0_4_ = (float)local_18a0;
              local_2a0._4_4_ = (float)((ulong)local_18a0 >> 0x20);
              uStack_298._0_4_ = (float)uStack_1898;
              uStack_298._4_4_ = (float)((ulong)uStack_1898 >> 0x20);
              local_1890 = (float)local_290._0_4_ + (float)local_2a0;
              fStack_188c = (float)local_290._4_4_ + local_2a0._4_4_;
              fStack_1888 = fStack_288 + (float)uStack_298;
              fStack_1884 = fStack_1884 + uStack_298._4_4_;
              local_348 = local_1830;
              local_360 = CONCAT44(fStack_188c,local_1890);
              uStack_358 = CONCAT44(fStack_1884,fStack_1888);
              auVar16._8_8_ = uStack_358;
              auVar16._0_8_ = local_360;
              *local_1830 = auVar16;
              local_17e0 = local_17e0 + 4;
              local_1830 = local_1830 + 1;
              local_2a0 = local_18a0;
              uStack_298 = uStack_1898;
              _local_290 = auVar7;
            }
          }
        }
      }
      else {
        local_18a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
        pfVar23 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0)
        ;
        local_220 = *pfVar23;
        local_18c0 = CONCAT44(local_220,local_220);
        uStack_18b8 = CONCAT44(local_220,local_220);
        fStack_21c = local_220;
        fStack_218 = local_220;
        fStack_214 = local_220;
        local_204 = local_220;
        pfVar23 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),1)
        ;
        local_240 = *pfVar23;
        local_18d0._4_4_ = local_240;
        local_18d0._0_4_ = local_240;
        local_18d0._8_4_ = local_240;
        local_18d0._12_4_ = local_240;
        fStack_23c = local_240;
        fStack_238 = local_240;
        fStack_234 = local_240;
        local_224 = local_240;
        for (local_18d4 = 0; local_18d4 < local_a5c; local_18d4 = local_18d4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1928);
          ncnn::Mat::~Mat((Mat *)0x3822e5);
          local_18e0 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1978);
          ncnn::Mat::~Mat((Mat *)0x38233d);
          local_1930 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_19c8);
          ncnn::Mat::~Mat((Mat *)0x382395);
          local_1980 = pauVar28;
          for (local_19cc = 0; local_19cc < local_a64; local_19cc = local_19cc + 1) {
            local_4c8 = local_18e0;
            uVar3 = *(undefined8 *)local_18e0;
            uVar4 = *(undefined8 *)(local_18e0 + 2);
            local_4d0 = local_1930;
            uVar5 = *(undefined8 *)local_1930;
            uVar6 = *(undefined8 *)(local_1930 + 2);
            local_430._0_4_ = (float)uVar3;
            local_430._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_428._0_4_ = (float)uVar4;
            uStack_428._4_4_ = (float)((ulong)uVar4 >> 0x20);
            local_440._0_4_ = (float)local_18c0;
            local_440._4_4_ = (float)((ulong)local_18c0 >> 0x20);
            uStack_438._0_4_ = (float)uStack_18b8;
            uStack_438._4_4_ = (float)((ulong)uStack_18b8 >> 0x20);
            local_19e0 = CONCAT44(local_430._4_4_ * local_440._4_4_,
                                  (float)local_430 * (float)local_440);
            uStack_19d8 = CONCAT44(uStack_428._4_4_ * uStack_438._4_4_,
                                   (float)uStack_428 * (float)uStack_438);
            local_450._0_4_ = (float)uVar5;
            local_450._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_448._0_4_ = (float)uVar6;
            uStack_448._4_4_ = (float)((ulong)uVar6 >> 0x20);
            local_460._0_4_ = local_18d0._0_4_;
            local_460._4_4_ = local_18d0._4_4_;
            uStack_458._0_4_ = local_18d0._8_4_;
            uStack_458._4_4_ = local_18d0._12_4_;
            local_19f0 = (float)local_450 * (float)local_460;
            fStack_19ec = local_450._4_4_ * local_460._4_4_;
            fStack_19e8 = (float)uStack_448 * (float)uStack_458;
            fStack_19e4 = uStack_448._4_4_ * uStack_458._4_4_;
            local_2b0._4_4_ = fStack_19ec;
            local_2b0._0_4_ = local_19f0;
            local_2b0._8_4_ = fStack_19e8;
            local_2b0._12_4_ = fStack_19e4;
            local_2c0 = local_19e0;
            uStack_2b8 = uStack_19d8;
            local_19e0 = CONCAT44(fStack_19ec + local_430._4_4_ * local_440._4_4_,
                                  local_19f0 + (float)local_430 * (float)local_440);
            uStack_19d8 = CONCAT44(fStack_19e4 + uStack_428._4_4_ * uStack_438._4_4_,
                                   fStack_19e8 + (float)uStack_428 * (float)uStack_438);
            local_368 = local_1980;
            local_380 = local_19e0;
            uStack_378 = uStack_19d8;
            auVar15._8_8_ = uStack_19d8;
            auVar15._0_8_ = local_19e0;
            *local_1980 = auVar15;
            local_18e0 = local_18e0 + 4;
            local_1930 = local_1930 + 4;
            local_1980 = local_1980 + 1;
            local_460 = local_18d0._0_8_;
            uStack_458 = local_18d0._8_8_;
            local_450 = uVar5;
            uStack_448 = uVar6;
            local_440 = local_18c0;
            uStack_438 = uStack_18b8;
            local_430 = uVar3;
            uStack_428 = uVar4;
          }
        }
        for (local_19f8 = 2; uVar29 = local_19f8,
            sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
            uVar29 < sVar25; local_19f8 = local_19f8 + 1) {
          local_1a00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_a38,local_19f8);
          pfVar23 = ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),local_19f8)
          ;
          local_260 = *pfVar23;
          local_1a10._4_4_ = local_260;
          local_1a10._0_4_ = local_260;
          local_1a10._8_4_ = local_260;
          local_1a10._12_4_ = local_260;
          fStack_25c = local_260;
          fStack_258 = local_260;
          fStack_254 = local_260;
          local_244 = local_260;
          for (local_1a14 = 0; local_1a14 < local_a5c; local_1a14 = local_1a14 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1a68);
            ncnn::Mat::~Mat((Mat *)0x3826f8);
            local_1a20 = pfVar23;
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1ab8);
            ncnn::Mat::~Mat((Mat *)0x382750);
            local_1a70 = pauVar28;
            for (local_1abc = 0; local_1abc < local_a64; local_1abc = local_1abc + 1) {
              local_4d8 = local_1a20;
              uVar3 = *(undefined8 *)local_1a20;
              uVar4 = *(undefined8 *)(local_1a20 + 2);
              local_4e0 = local_1a70;
              uVar5 = *(undefined8 *)*local_1a70;
              uVar6 = *(undefined8 *)(*local_1a70 + 8);
              local_470._0_4_ = (float)uVar3;
              local_470._4_4_ = (float)((ulong)uVar3 >> 0x20);
              uStack_468._0_4_ = (float)uVar4;
              uStack_468._4_4_ = (float)((ulong)uVar4 >> 0x20);
              local_480._0_4_ = local_1a10._0_4_;
              local_480._4_4_ = local_1a10._4_4_;
              uStack_478._0_4_ = local_1a10._8_4_;
              uStack_478._4_4_ = local_1a10._12_4_;
              local_1ad0 = (float)local_470 * (float)local_480;
              fStack_1acc = local_470._4_4_ * local_480._4_4_;
              fStack_1ac8 = (float)uStack_468 * (float)uStack_478;
              fStack_1ac4 = uStack_468._4_4_ * uStack_478._4_4_;
              local_2d0._4_4_ = fStack_1acc;
              local_2d0._0_4_ = local_1ad0;
              local_2d0._8_4_ = fStack_1ac8;
              local_2d0._12_4_ = fStack_1ac4;
              local_2e0._0_4_ = (float)uVar5;
              local_2e0._4_4_ = (float)((ulong)uVar5 >> 0x20);
              uStack_2d8._0_4_ = (float)uVar6;
              uStack_2d8._4_4_ = (float)((ulong)uVar6 >> 0x20);
              local_1ae0 = CONCAT44(fStack_1acc + local_2e0._4_4_,local_1ad0 + (float)local_2e0);
              uStack_1ad8 = CONCAT44(fStack_1ac4 + uStack_2d8._4_4_,fStack_1ac8 + (float)uStack_2d8)
              ;
              local_388 = local_1a70;
              local_3a0 = local_1ae0;
              uStack_398 = uStack_1ad8;
              auVar14._8_8_ = uStack_1ad8;
              auVar14._0_8_ = local_1ae0;
              *local_1a70 = auVar14;
              local_1a20 = local_1a20 + 4;
              local_1a70 = local_1a70 + 1;
              local_480 = local_1a10._0_8_;
              uStack_478 = local_1a10._8_8_;
              local_470 = uVar3;
              uStack_468 = uVar4;
              local_2e0 = uVar5;
              uStack_2d8 = uVar6;
            }
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_1ae8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
      for (local_1aec = 0; local_1aec < local_a5c; local_1aec = local_1aec + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1b40);
        ncnn::Mat::~Mat((Mat *)0x3829dd);
        local_1af8 = pauVar28;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1b90);
        ncnn::Mat::~Mat((Mat *)0x382a35);
        local_1b48 = pauVar28;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1be0);
        ncnn::Mat::~Mat((Mat *)0x382a8d);
        local_1b98 = pauVar28;
        for (local_1be4 = 0; local_1be4 < local_a64; local_1be4 = local_1be4 + 1) {
          local_4e8 = local_1af8;
          local_1d0 = *(undefined8 *)*local_1af8;
          uStack_1c8 = *(undefined8 *)(*local_1af8 + 8);
          local_4f0 = local_1b48;
          local_1c10 = *(undefined8 *)*local_1b48;
          uStack_1c08 = *(undefined8 *)(*local_1b48 + 8);
          local_1c00 = vmaxps_avx(*local_1af8,*local_1b48);
          local_3a8 = local_1b98;
          local_3c0 = local_1c00._0_8_;
          uStack_3b8 = local_1c00._8_8_;
          *local_1b98 = local_1c00;
          local_1af8 = local_1af8 + 1;
          local_1b48 = local_1b48 + 1;
          local_1b98 = local_1b98 + 1;
          local_1e0 = local_1c10;
          uStack_1d8 = uStack_1c08;
        }
      }
      for (local_1c18 = 2; uVar29 = local_1c18,
          sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
          uVar29 < sVar25; local_1c18 = local_1c18 + 1) {
        local_1c20 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_a38,local_1c18);
        for (local_1c24 = 0; local_1c24 < local_a5c; local_1c24 = local_1c24 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1c78);
          ncnn::Mat::~Mat((Mat *)0x382d1d);
          local_1c30 = pauVar28;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pauVar28 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_1cc8);
          ncnn::Mat::~Mat((Mat *)0x382d75);
          local_1c80 = pauVar28;
          for (local_1ccc = 0; local_1ccc < local_a64; local_1ccc = local_1ccc + 1) {
            local_4f8 = local_1c80;
            local_1f0 = *(undefined8 *)*local_1c80;
            uStack_1e8 = *(undefined8 *)(*local_1c80 + 8);
            local_500 = local_1c30;
            local_1cf0 = *(undefined8 *)*local_1c30;
            uStack_1ce8 = *(undefined8 *)(*local_1c30 + 8);
            local_1ce0 = vmaxps_avx(*local_1c80,*local_1c30);
            local_3c8 = local_1c80;
            local_3e0 = local_1ce0._0_8_;
            uStack_3d8 = local_1ce0._8_8_;
            *local_1c80 = local_1ce0;
            local_1c30 = local_1c30 + 1;
            local_1c80 = local_1c80 + 1;
            local_200 = local_1cf0;
            uStack_1f8 = uStack_1ce8;
          }
        }
      }
    }
    local_a24 = 0;
  }
  else {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_1cf8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
      for (local_1cfc = 0; local_1cfc < local_a5c; local_1cfc = local_1cfc + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1d50);
        ncnn::Mat::~Mat((Mat *)0x382fd5);
        local_1d08 = pfVar23;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1da0);
        ncnn::Mat::~Mat((Mat *)0x38302d);
        local_1d58 = pfVar23;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1df0);
        ncnn::Mat::~Mat((Mat *)0x383085);
        local_1da8 = pfVar23;
        for (local_1df4 = local_a64; 0 < local_1df4; local_1df4 = local_1df4 + -1) {
          *local_1da8 = *local_1d08 * *local_1d58;
          local_1d08 = local_1d08 + 1;
          local_1d58 = local_1d58 + 1;
          local_1da8 = local_1da8 + 1;
        }
      }
      for (local_1e00 = 2; uVar29 = local_1e00,
          sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
          uVar29 < sVar25; local_1e00 = local_1e00 + 1) {
        local_1e08 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_a38,local_1e00);
        for (local_1e0c = 0; local_1e0c < local_a5c; local_1e0c = local_1e0c + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1e60);
          ncnn::Mat::~Mat((Mat *)0x383272);
          local_1e18 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1eb0);
          ncnn::Mat::~Mat((Mat *)0x3832ca);
          local_1e68 = pfVar23;
          for (local_1eb4 = local_a64; 0 < local_1eb4; local_1eb4 = local_1eb4 + -1) {
            *local_1e68 = *local_1e18 * *local_1e68;
            local_1e18 = local_1e18 + 1;
            local_1e68 = local_1e68 + 1;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_1ec0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
        for (local_1ec4 = 0; local_1ec4 < local_a5c; local_1ec4 = local_1ec4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1f18);
          ncnn::Mat::~Mat((Mat *)0x383489);
          local_1ed0 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1f68);
          ncnn::Mat::~Mat((Mat *)0x3834e1);
          local_1f20 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_1fb8);
          ncnn::Mat::~Mat((Mat *)0x383539);
          local_1f70 = pfVar23;
          for (local_1fbc = local_a64; 0 < local_1fbc; local_1fbc = local_1fbc + -1) {
            *local_1f70 = *local_1ed0 + *local_1f20;
            local_1ed0 = local_1ed0 + 1;
            local_1f20 = local_1f20 + 1;
            local_1f70 = local_1f70 + 1;
          }
        }
        for (local_1fc8 = 2; uVar29 = local_1fc8,
            sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
            uVar29 < sVar25; local_1fc8 = local_1fc8 + 1) {
          local_1fd0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_a38,local_1fc8);
          for (local_1fd4 = 0; local_1fd4 < local_a5c; local_1fd4 = local_1fd4 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_2028);
            ncnn::Mat::~Mat((Mat *)0x383726);
            local_1fe0 = pfVar23;
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_2078);
            ncnn::Mat::~Mat((Mat *)0x38377e);
            local_2030 = pfVar23;
            for (local_207c = local_a64; 0 < local_207c; local_207c = local_207c + -1) {
              *local_2030 = *local_1fe0 + *local_2030;
              local_1fe0 = local_1fe0 + 1;
              local_2030 = local_2030 + 1;
            }
          }
        }
      }
      else {
        local_2088 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
        pfVar23 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0)
        ;
        local_208c = *pfVar23;
        pfVar23 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),1)
        ;
        local_2090 = *pfVar23;
        for (local_2094 = 0; local_2094 < local_a5c; local_2094 = local_2094 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_20e8);
          ncnn::Mat::~Mat((Mat *)0x38395f);
          local_20a0 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_2138);
          ncnn::Mat::~Mat((Mat *)0x3839b7);
          local_20f0 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_2188);
          ncnn::Mat::~Mat((Mat *)0x383a0f);
          local_2140 = pfVar23;
          for (local_218c = local_a64; 0 < local_218c; local_218c = local_218c + -1) {
            *local_2140 = *local_20a0 * local_208c + *local_20f0 * local_2090;
            local_20a0 = local_20a0 + 1;
            local_20f0 = local_20f0 + 1;
            local_2140 = local_2140 + 1;
          }
        }
        for (local_2198 = 2; uVar29 = local_2198,
            sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
            uVar29 < sVar25; local_2198 = local_2198 + 1) {
          local_21a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_a38,local_2198);
          pfVar23 = ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),local_2198)
          ;
          local_21a4 = *pfVar23;
          for (local_21a8 = 0; local_21a8 < local_a5c; local_21a8 = local_21a8 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_21f8);
            ncnn::Mat::~Mat((Mat *)0x383c33);
            local_21b0 = pfVar23;
            ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                               (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
            pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_2248);
            ncnn::Mat::~Mat((Mat *)0x383c7f);
            local_2200 = pfVar23;
            for (local_224c = local_a64; 0 < local_224c; local_224c = local_224c + -1) {
              *local_2200 = *local_21b0 * local_21a4 + *local_2200;
              local_21b0 = local_21b0 + 1;
              local_2200 = local_2200 + 1;
            }
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_2258 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
      for (local_225c = 0; _c = (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20),
          local_225c < local_a5c; local_225c = local_225c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,_c);
        pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_22b0);
        ncnn::Mat::~Mat((Mat *)0x383e20);
        local_2268 = pfVar23;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,_c);
        pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_2300);
        ncnn::Mat::~Mat((Mat *)0x383e6c);
        in_stack_ffffffffffffd7c8 = &local_2350;
        local_22b8 = pfVar23;
        ncnn::Mat::channel(in_stack_ffffffffffffd7d0,(int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20)
                          );
        in_stack_ffffffffffffd7d0 =
             (Mat *)ncnn::Mat::operator_cast_to_float_(in_stack_ffffffffffffd7c8);
        ncnn::Mat::~Mat((Mat *)0x383eb8);
        local_2308 = in_stack_ffffffffffffd7d0;
        for (local_2354 = local_a64; 0 < local_2354; local_2354 = local_2354 + -1) {
          pfVar23 = std::max<float>(local_2268,local_22b8);
          *(float *)&local_2308->data = *pfVar23;
          local_2268 = local_2268 + 1;
          local_22b8 = local_22b8 + 1;
          local_2308 = (Mat *)((long)&local_2308->data + 4);
        }
      }
      local_2360 = 2;
      while (uVar29 = local_2360,
            sVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38),
            uVar29 < sVar25) {
        local_2368 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_a38,local_2360);
        for (local_236c = 0; local_236c < local_a5c; local_236c = local_236c + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_23c0);
          ncnn::Mat::~Mat((Mat *)0x384094);
          local_2378 = pfVar23;
          ncnn::Mat::channel(in_stack_ffffffffffffd7d0,
                             (int)((ulong)in_stack_ffffffffffffd7c8 >> 0x20));
          pfVar23 = ncnn::Mat::operator_cast_to_float_(&local_2410);
          ncnn::Mat::~Mat((Mat *)0x3840de);
          local_23c8 = pfVar23;
          for (local_2414 = local_a64; 0 < local_2414; local_2414 = local_2414 + -1) {
            pfVar23 = std::max<float>(local_2378,local_23c8);
            *local_23c8 = *pfVar23;
            local_2378 = local_2378 + 1;
            local_23c8 = local_23c8 + 1;
          }
        }
        local_2360 = local_2360 + 1;
      }
    }
    local_a24 = 0;
  }
  return local_a24;
}

Assistant:

int Eltwise_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}